

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3Fts3InitTokenizer(Fts3Hash *pHash,char *zArg,sqlite3_tokenizer **ppTok,char **pzErr)

{
  bool bVar1;
  int iVar2;
  char *__s;
  size_t sVar3;
  char *pcVar4;
  size_t sVar5;
  Fts3HashElem *pFVar6;
  sqlite3_tokenizer_module *psVar7;
  char **ppcVar8;
  char **p;
  long lVar9;
  int iVar10;
  long in_FS_OFFSET;
  int n;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_3c = 0;
  __s = sqlite3_mprintf("%s");
  iVar10 = 7;
  if (__s != (char *)0x0) {
    sVar3 = strlen(__s);
    pcVar4 = sqlite3Fts3NextToken(__s,&local_3c);
    if (pcVar4 == (char *)0x0) {
      pcVar4 = __s;
    }
    lVar9 = (long)local_3c;
    pcVar4[lVar9] = '\0';
    sqlite3Fts3Dequote(pcVar4);
    sVar5 = strlen(pcVar4);
    pFVar6 = sqlite3Fts3HashFindElem(pHash,pcVar4,(int)sVar5 + 1);
    if (pFVar6 == (Fts3HashElem *)0x0) {
      psVar7 = (sqlite3_tokenizer_module *)0x0;
    }
    else {
      psVar7 = (sqlite3_tokenizer_module *)pFVar6->data;
    }
    if (psVar7 == (sqlite3_tokenizer_module *)0x0) {
      sqlite3Fts3ErrMsg(pzErr,"unknown tokenizer: %s",pcVar4);
      iVar2 = 1;
    }
    else {
      pcVar4 = pcVar4 + lVar9;
      p = (char **)0x0;
      iVar10 = 0;
      while ((pcVar4 + 1 < __s + sVar3 &&
             (pcVar4 = sqlite3Fts3NextToken(pcVar4 + 1,&local_3c), pcVar4 != (char *)0x0))) {
        iVar2 = sqlite3_initialize();
        if (iVar2 == 0) {
          ppcVar8 = (char **)sqlite3Realloc(p,(long)(iVar10 + 1) << 3);
        }
        else {
          ppcVar8 = (char **)0x0;
        }
        if (ppcVar8 == (char **)0x0) {
          sqlite3_free(__s);
          sqlite3_free(p);
          iVar2 = -0x55555556;
          bVar1 = false;
          goto LAB_001ca2ec;
        }
        ppcVar8[iVar10] = pcVar4;
        lVar9 = (long)local_3c;
        pcVar4[lVar9] = '\0';
        sqlite3Fts3Dequote(pcVar4);
        pcVar4 = pcVar4 + lVar9;
        p = ppcVar8;
        iVar10 = iVar10 + 1;
      }
      iVar2 = (*psVar7->xCreate)(iVar10,p,ppTok);
      if (iVar2 == 0) {
        (*ppTok)->pModule = psVar7;
      }
      else {
        sqlite3Fts3ErrMsg(pzErr,"unknown tokenizer");
      }
      sqlite3_free(p);
      bVar1 = true;
LAB_001ca2ec:
      iVar10 = 7;
      if (!bVar1) goto LAB_001ca300;
    }
    iVar10 = iVar2;
    sqlite3_free(__s);
  }
LAB_001ca300:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar10;
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts3InitTokenizer(
  Fts3Hash *pHash,                /* Tokenizer hash table */
  const char *zArg,               /* Tokenizer name */
  sqlite3_tokenizer **ppTok,      /* OUT: Tokenizer (if applicable) */
  char **pzErr                    /* OUT: Set to malloced error message */
){
  int rc;
  char *z = (char *)zArg;
  int n = 0;
  char *zCopy;
  char *zEnd;                     /* Pointer to nul-term of zCopy */
  sqlite3_tokenizer_module *m;

  zCopy = sqlite3_mprintf("%s", zArg);
  if( !zCopy ) return SQLITE_NOMEM;
  zEnd = &zCopy[strlen(zCopy)];

  z = (char *)sqlite3Fts3NextToken(zCopy, &n);
  if( z==0 ){
    assert( n==0 );
    z = zCopy;
  }
  z[n] = '\0';
  sqlite3Fts3Dequote(z);

  m = (sqlite3_tokenizer_module *)sqlite3Fts3HashFind(pHash,z,(int)strlen(z)+1);
  if( !m ){
    sqlite3Fts3ErrMsg(pzErr, "unknown tokenizer: %s", z);
    rc = SQLITE_ERROR;
  }else{
    char const **aArg = 0;
    int iArg = 0;
    z = &z[n+1];
    while( z<zEnd && (NULL!=(z = (char *)sqlite3Fts3NextToken(z, &n))) ){
      sqlite3_int64 nNew = sizeof(char *)*(iArg+1);
      char const **aNew = (const char **)sqlite3_realloc64((void *)aArg, nNew);
      if( !aNew ){
        sqlite3_free(zCopy);
        sqlite3_free((void *)aArg);
        return SQLITE_NOMEM;
      }
      aArg = aNew;
      aArg[iArg++] = z;
      z[n] = '\0';
      sqlite3Fts3Dequote(z);
      z = &z[n+1];
    }
    rc = m->xCreate(iArg, aArg, ppTok);
    assert( rc!=SQLITE_OK || *ppTok );
    if( rc!=SQLITE_OK ){
      sqlite3Fts3ErrMsg(pzErr, "unknown tokenizer");
    }else{
      (*ppTok)->pModule = m;
    }
    sqlite3_free((void *)aArg);
  }

  sqlite3_free(zCopy);
  return rc;
}